

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetAppBundleDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          BundleDirectoryLevel level)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  cmValue cVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  size_type __dnew;
  string local_98;
  string local_68;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  undefined8 local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_30;
  
  GetFullName(&local_68,this,config,RuntimeBinaryArtifact);
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = &DAT_00000001;
  local_98.field_2._M_local_buf[0] = 0x2e;
  local_48._M_len = local_68._M_string_length;
  local_48._M_str = local_68._M_dataplus._M_p;
  local_38 = 1;
  views._M_len = 2;
  views._M_array = &local_48;
  local_98._M_string_length = (size_type)paVar1;
  local_30 = paVar1;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_48._M_len = 0x10;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  local_98._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_48);
  local_98.field_2._M_allocated_capacity = local_48._M_len;
  builtin_strncpy(local_98._M_dataplus._M_p,"BUNDLE_EXTENSION",0x10);
  local_98._M_string_length = local_48._M_len;
  local_98._M_dataplus._M_p[local_48._M_len] = '\0';
  cVar4 = GetProperty(this,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (cVar4.Value == (string *)0x0) {
    local_98._M_string_length = 3;
    local_98.field_2._M_allocated_capacity._0_4_ = 0x707061;
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    pcVar2 = ((cVar4.Value)->_M_dataplus)._M_p;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar2,pcVar2 + (cVar4.Value)->_M_string_length);
  }
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (level - ContentLevel < 2) {
    bVar3 = cmMakefile::PlatformIsAppleEmbedded(this->Makefile);
    if (!bVar3) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (level == FullLevel) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetAppBundleDirectory(
  const std::string& config, BundleDirectoryLevel level) const
{
  std::string fpath = cmStrCat(
    this->GetFullName(config, cmStateEnums::RuntimeBinaryArtifact), '.');
  cmValue ext = this->GetProperty("BUNDLE_EXTENSION");
  fpath += (ext ? *ext : "app");
  if (shouldAddContentLevel(level) &&
      !this->Makefile->PlatformIsAppleEmbedded()) {
    fpath += "/Contents";
    if (shouldAddFullLevel(level)) {
      fpath += "/MacOS";
    }
  }
  return fpath;
}